

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid2d_refinement_pattern.cc
# Opt level: O0

ostream * lf::refinement::operator<<(ostream *o,RefPat *refpat)

{
  RefPat *refpat_local;
  ostream *o_local;
  
  switch(*refpat) {
  case rp_nil:
    std::operator<<(o,"rp_nil");
    break;
  case rp_copy:
    std::operator<<(o,"rp_copy");
    break;
  case rp_split:
    std::operator<<(o,"rp_split");
    break;
  case rp_bisect:
    std::operator<<(o,"rp_bisect");
    break;
  case rp_trisect:
    std::operator<<(o,"rp_trisect");
    break;
  case rp_trisect_left:
    std::operator<<(o,"rp_trisect_left");
    break;
  case rp_quadsect:
    std::operator<<(o,"rp_quadsect");
    break;
  case rp_threeedge:
    std::operator<<(o,"rp_threeedge");
    break;
  case rp_regular:
    std::operator<<(o,"rp_regular");
    break;
  case rp_barycentric:
    std::operator<<(o,"rp_barycentric");
  }
  return o;
}

Assistant:

std::ostream &operator<<(std::ostream &o, const RefPat &refpat) {
  switch (refpat) {
    case rp_nil:
      o << "rp_nil";
      break;
    case rp_copy:
      o << "rp_copy";
      break;
    case rp_split:
      o << "rp_split";
      break;
    case rp_bisect:
      o << "rp_bisect";
      break;
    case rp_trisect:
      o << "rp_trisect";
      break;
    case rp_trisect_left:
      o << "rp_trisect_left";
      break;
    case rp_quadsect:
      o << "rp_quadsect";
      break;
    case rp_threeedge:
      o << "rp_threeedge";
      break;
    case rp_regular:
      o << "rp_regular";
      break;
    case rp_barycentric:
      o << "rp_barycentric";
      break;
  }
  return o;
}